

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

bool __thiscall
Js::ByteCodeWriter::TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,InlineCacheIndex inlineCacheIndex,bool isRootLoad,
          CallFlags callFlags)

{
  RealCount *pRVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  Type pSVar6;
  bool bVar7;
  undefined1 local_3b;
  char local_3a;
  undefined1 local_39;
  InlineCacheIndex local_38;
  undefined1 uStack_34;
  OpLayoutT_CallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_015b5fbd == '\0') && (DAT_015b5fbc == '\0')) &&
      (local_3a = (char)returnValueRegister, (int)local_3a == returnValueRegister)) &&
     ((local_39 = (undefined1)functionRegister, functionRegister < 0x100 &&
      (local_3b = (undefined1)givenArgCount, givenArgCount < 0x100)))) {
    _uStack_34 = callFlags;
    local_38 = inlineCacheIndex;
    uVar4 = Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,&local_3b,0xb);
    bVar7 = true;
    if (isRootLoad) {
      if ((ulong)uVar4 + (ulong)(MaxByteSizedOpcodes < op) * 2 + 0xc !=
          (ulong)(this->m_byteCodeData).currentOffset) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x4a7,
                                    "(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIFlagsWithICIndex<SizePolicy>))"
                                    ,
                                    "m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIFlagsWithICIndex<SizePolicy>)"
                                   );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pSVar6 = (Type)new<Memory::ArenaAllocator>
                               (0x10,(this->m_labelOffsets->
                                     super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>
                                     ).alloc,0x366bee);
      pSVar6[1].next = (Type)((ulong)uVar4 + (ulong)(MaxByteSizedOpcodes < op) * 2 + 4);
      pSVar6->next = (this->rootObjectLoadMethodInlineCacheOffsets).
                     super_SListNodeBase<Memory::ArenaAllocator>.next;
      (this->rootObjectLoadMethodInlineCacheOffsets).super_SListNodeBase<Memory::ArenaAllocator>.
      next = pSVar6;
      pRVar1 = &(this->rootObjectLoadMethodInlineCacheOffsets).super_RealCount;
      pRVar1->count = pRVar1->count + 1;
    }
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool ByteCodeWriter::TryWriteCallIFlagsWithICIndex(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, InlineCacheIndex inlineCacheIndex, bool isRootLoad, CallFlags callFlags)
    {
        OpLayoutT_CallIFlagsWithICIndex<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Return, returnValueRegister) && SizePolicy::Assign(layout.Function, functionRegister)
            && SizePolicy::Assign(layout.ArgCount, givenArgCount) && SizePolicy::Assign(layout.inlineCacheIndex, inlineCacheIndex)
            && SizePolicy::Assign(layout.callFlags, callFlags))
        {
            size_t offset = m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);

            if (isRootLoad)
            {
                Assert(m_byteCodeData.GetCurrentOffset() == offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum) + sizeof(OpLayoutT_CallIFlagsWithICIndex<SizePolicy>));
                size_t inlineCacheOffset = offset + OpCodeUtil::EncodedSize(op, SizePolicy::LayoutEnum)
                    + offsetof(OpLayoutT_CallIFlagsWithICIndex<SizePolicy>, inlineCacheIndex);

                rootObjectLoadMethodInlineCacheOffsets.Prepend(m_labelOffsets->GetAllocator(), inlineCacheOffset);
            }
            return true;
        }
        return false;
    }